

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O3

Roaring * __thiscall
roaring::Roaring::operator|(Roaring *__return_storage_ptr__,Roaring *this,Roaring *o)

{
  container_s **ppcVar1;
  uint8_t *puVar2;
  undefined7 uVar3;
  int32_t iVar4;
  int32_t iVar5;
  roaring_bitmap_t *__ptr;
  runtime_error *this_00;
  
  __ptr = roaring_bitmap_or((roaring_bitmap_t *)this,(roaring_bitmap_t *)o);
  if (__ptr != (roaring_bitmap_t *)0x0) {
    uVar3 = *(undefined7 *)&(__ptr->high_low_container).field_0x21;
    (__return_storage_ptr__->roaring).high_low_container.flags = (__ptr->high_low_container).flags;
    *(undefined7 *)&(__return_storage_ptr__->roaring).high_low_container.field_0x21 = uVar3;
    iVar4 = (__ptr->high_low_container).size;
    iVar5 = (__ptr->high_low_container).allocation_size;
    ppcVar1 = (container_s **)(__ptr->high_low_container).containers;
    puVar2 = (__ptr->high_low_container).typecodes;
    (__return_storage_ptr__->roaring).high_low_container.keys = (__ptr->high_low_container).keys;
    (__return_storage_ptr__->roaring).high_low_container.typecodes = puVar2;
    (__return_storage_ptr__->roaring).high_low_container.size = iVar4;
    (__return_storage_ptr__->roaring).high_low_container.allocation_size = iVar5;
    (__return_storage_ptr__->roaring).high_low_container.containers = ppcVar1;
    roaring_free(__ptr);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"failed materalization in or");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Roaring operator|(const Roaring &o) const {
        roaring_bitmap_t *r = api::roaring_bitmap_or(&roaring, &o.roaring);
        if (r == NULL) {
            ROARING_TERMINATE("failed materalization in or");
        }
        return Roaring(r);
    }